

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_early_data_reason_t bssl::should_offer_early_data(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  Span<const_unsigned_char> lhs;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  size_t in_RCX;
  size_t in_R8;
  Span<const_unsigned_char> protocol;
  Span<const_unsigned_char> protocol_00;
  Span<const_unsigned_char> local_70;
  SSL *local_60;
  uchar *local_58;
  Span<const_unsigned_char> *local_50;
  uchar *local_48;
  undefined1 local_40 [8];
  Span<const_unsigned_char> settings;
  uchar *local_28;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (((ssl_00->field_0xa4 & 1 ^ 0xff) & 1) == 0) {
    __assert_fail("!ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x126,
                  "ssl_early_data_reason_t bssl::should_offer_early_data(const SSL_HANDSHAKE *)");
  }
  if (((byte)ssl_00->field_0xa4 >> 2 & 1) == 0) {
    return ssl_early_data_disabled;
  }
  if ((hs->max_version < 0x304) || (iVar3 = SSL_is_dtls(ssl_00), iVar3 != 0)) {
    return ssl_early_data_protocol_version;
  }
  bVar1 = std::operator==(&ssl_00->session,(nullptr_t)0x0);
  if (bVar1) {
    return ssl_early_data_no_session_offered;
  }
  psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&ssl_00->session);
  uVar2 = ssl_session_protocol_version(psVar4);
  if ((0x303 < uVar2) &&
     (psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&ssl_00->session), psVar4->ticket_max_early_data != 0)) {
    psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&ssl_00->session);
    bVar1 = Array<unsigned_char>::empty(&psVar4->early_alpn);
    if (!bVar1) {
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&ssl_00->session);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&settings.size_,&psVar4->early_alpn);
      protocol_00.size_ = in_RCX;
      protocol_00.data_ = local_28;
      bVar1 = ssl_is_alpn_protocol_allowed((bssl *)hs,(SSL_HANDSHAKE *)settings.size_,protocol_00);
      if (!bVar1) {
        return ssl_early_data_alpn_mismatch;
      }
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&ssl_00->session);
      if (((byte)psVar4->field_0x1b8 >> 6 & 1) != 0) {
        Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_40);
        psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           (&ssl_00->session);
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_50,&psVar4->early_alpn);
        protocol.size_ = in_R8;
        protocol.data_ = local_48;
        bVar1 = ssl_get_local_application_settings
                          ((bssl *)hs,(SSL_HANDSHAKE *)local_40,local_50,protocol);
        if (bVar1) {
          local_60 = (SSL *)local_40;
          local_58 = settings.data_;
          psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             (&ssl_00->session);
          Span<unsigned_char_const>::
          Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_70,&psVar4->local_application_settings);
          lhs.size_ = (size_t)local_58;
          lhs.data_ = (uchar *)local_60;
          bVar1 = internal::operator!=(lhs,local_70);
          if (!bVar1) {
            return ssl_early_data_accepted;
          }
        }
        return ssl_early_data_alps_mismatch;
      }
    }
    return ssl_early_data_accepted;
  }
  return ssl_early_data_unsupported_for_session;
}

Assistant:

static ssl_early_data_reason_t should_offer_early_data(
    const SSL_HANDSHAKE *hs) {
  const SSL *const ssl = hs->ssl;
  assert(!ssl->server);
  if (!ssl->enable_early_data) {
    return ssl_early_data_disabled;
  }

  if (hs->max_version < TLS1_3_VERSION || SSL_is_dtls(ssl)) {
    // We discard inapplicable sessions, so this is redundant with the session
    // checks below, but reporting that TLS 1.3 was disabled is more useful.
    //
    // TODO(crbug.com/381113363): Support early data in DTLS 1.3.
    return ssl_early_data_protocol_version;
  }

  if (ssl->session == nullptr) {
    return ssl_early_data_no_session_offered;
  }

  if (ssl_session_protocol_version(ssl->session.get()) < TLS1_3_VERSION ||
      ssl->session->ticket_max_early_data == 0) {
    return ssl_early_data_unsupported_for_session;
  }

  if (!ssl->session->early_alpn.empty()) {
    if (!ssl_is_alpn_protocol_allowed(hs, ssl->session->early_alpn)) {
      // Avoid reporting a confusing value in |SSL_get0_alpn_selected|.
      return ssl_early_data_alpn_mismatch;
    }

    // If the previous connection negotiated ALPS, only offer 0-RTT when the
    // local are settings are consistent with what we'd offer for this
    // connection.
    if (ssl->session->has_application_settings) {
      Span<const uint8_t> settings;
      if (!ssl_get_local_application_settings(hs, &settings,
                                              ssl->session->early_alpn) ||
          settings != ssl->session->local_application_settings) {
        return ssl_early_data_alps_mismatch;
      }
    }
  }

  // Early data has not yet been accepted, but we use it as a success code.
  return ssl_early_data_accepted;
}